

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

void __thiscall RTLsTy::RegisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  pointer pp_Var1;
  pointer pDVar2;
  _List_node_base **pp_Var3;
  pointer pDVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  int32_t *piVar12;
  ulong uVar13;
  __tgt_device_image *p_Var14;
  _List_node_base *p_Var15;
  __tgt_offload_entry *p_Var16;
  _List_node_base *p_Var17;
  PendingCtorsDtorsPerLibrary *this_00;
  __tgt_offload_entry **__x;
  bool bVar18;
  DeviceTy device;
  RTLInfoTy *local_168;
  _List_node_base *local_160;
  __tgt_offload_entry **local_158;
  long local_150;
  __tgt_bin_desc *local_148;
  RTLInfoTy *local_140;
  int32_t local_138;
  bool local_134;
  once_flag local_130;
  bool local_12c;
  _List_node_base local_128;
  size_t local_118;
  _Rb_tree_impl<std::less<__tgt_bin_desc_*>,_true> _Stack_110;
  _Rb_tree_impl<std::less<void_*>,_true> a_Stack_e0 [3];
  
  local_148 = (__tgt_bin_desc *)LoadRTLs;
  local_140 = (RTLInfoTy *)0x0;
  local_168 = (RTLInfoTy *)this;
  std::call_once<void(RTLsTy::*)(),RTLsTy*>
            (&this->initFlag,(offset_in_RTLsTy_to_subr *)&local_148,(RTLsTy **)&local_168);
  std::mutex::lock(&RTLsMtx);
  __x = &desc->HostEntriesBegin;
  p_Var15 = (_List_node_base *)&RTLs.AllRTLs;
  lVar7 = 0;
  local_160 = (_List_node_base *)&RTLs.AllRTLs;
  local_158 = __x;
  do {
    if (desc->NumDeviceImages <= lVar7) {
      pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
      return;
    }
    p_Var14 = desc->DeviceImages + lVar7;
    p_Var17 = p_Var15;
    local_150 = lVar7;
    do {
      p_Var17 = (((_List_base<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)&p_Var17->_M_next)->_M_impl).
                _M_node.super__List_node_base._M_next;
      if (p_Var17 == p_Var15) goto LAB_00103ec8;
      iVar5 = (**(code **)(p_Var17 + 2))(p_Var14);
    } while (iVar5 == 0);
    pp_Var3 = &p_Var17[1]._M_next;
    if (*(char *)&p_Var17[7]._M_next == '\0') {
      local_148 = (__tgt_bin_desc *)CONCAT44(local_148._4_4_,0xffffffff);
      local_138 = -1;
      local_134 = false;
      local_130._M_once = 0;
      local_12c = false;
      local_128._M_next = &local_128;
      _Stack_110.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_110.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_110.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118 = 0;
      _Stack_110._0_8_ = 0;
      _Stack_110.super__Rb_tree_header._M_header._M_left =
           &_Stack_110.super__Rb_tree_header._M_header;
      a_Stack_e0[0].super__Rb_tree_header._M_header._M_color = _S_red;
      a_Stack_e0[0].super__Rb_tree_header._M_header._4_4_ = 0;
      a_Stack_e0[0].super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_110.super__Rb_tree_header._M_node_count = 0;
      a_Stack_e0[0]._0_8_ = 0;
      a_Stack_e0[0].super__Rb_tree_header._M_header._M_left =
           &a_Stack_e0[0].super__Rb_tree_header._M_header;
      local_140 = (RTLInfoTy *)pp_Var3;
      local_128._M_prev = local_128._M_next;
      _Stack_110.super__Rb_tree_header._M_header._M_right =
           _Stack_110.super__Rb_tree_header._M_header._M_left;
      a_Stack_e0[0].super__Rb_tree_header._M_header._M_right =
           a_Stack_e0[0].super__Rb_tree_header._M_header._M_left;
      memset(&a_Stack_e0[0].super__Rb_tree_header._M_node_count,0,0x88);
      lVar7 = ((long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x118;
      std::vector<DeviceTy,_std::allocator<DeviceTy>_>::resize
                (&Devices,*(int *)((long)(p_Var17 + 1) + 4) + lVar7,(DeviceTy *)&local_148);
      uVar8 = (ulong)*(uint *)((long)(p_Var17 + 1) + 4);
      if ((int)*(uint *)((long)(p_Var17 + 1) + 4) < 1) {
        uVar8 = 0;
      }
      piVar12 = &Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7].RTLDeviceID;
      for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        ((DeviceTy *)(piVar12 + -4))->DeviceID = (int)lVar7 + (int)uVar13;
        *piVar12 = (int)uVar13;
        piVar12 = piVar12 + 0x46;
      }
      if (RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar5 = 0;
      }
      else {
        iVar5 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->NumberOfDevices +
                RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->Idx;
      }
      *(int *)(p_Var17 + 1) = iVar5;
      *(undefined1 *)&p_Var17[7]._M_next = 1;
      local_168 = (RTLInfoTy *)pp_Var3;
      std::vector<RTLInfoTy*,std::allocator<RTLInfoTy*>>::emplace_back<RTLInfoTy*>
                ((vector<RTLInfoTy*,std::allocator<RTLInfoTy*>> *)&RTLs.UsedRTLs,&local_168);
      DeviceTy::~DeviceTy((DeviceTy *)&local_148);
    }
    std::mutex::lock(&TrlTblMtx);
    sVar9 = std::
            map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
            ::count(&HostEntriesBeginToTransTable,__x);
    if (sVar9 == 0) {
      pmVar10 = std::
                map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                ::operator[](&HostEntriesBeginToTransTable,__x);
      p_Var16 = __x[1];
      (pmVar10->HostTable).EntriesBegin = *__x;
      (pmVar10->HostTable).EntriesEnd = p_Var16;
    }
    pmVar10 = std::
              map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
              ::operator[](&HostEntriesBeginToTransTable,__x);
    iVar5 = *(int *)(p_Var17 + 1);
    uVar6 = *(uint *)((long)(p_Var17 + 1) + 4);
    uVar8 = (ulong)(uVar6 + iVar5);
    if ((ulong)((long)(pmVar10->TargetsTable).
                      super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pmVar10->TargetsTable).
                      super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar8) {
      local_148 = (__tgt_bin_desc *)0x0;
      std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::resize
                (&pmVar10->TargetsImages,uVar8,(value_type *)&local_148);
      local_148 = (__tgt_bin_desc *)0x0;
      std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::resize
                (&pmVar10->TargetsTable,uVar8,(value_type *)&local_148);
      iVar5 = *(int *)(p_Var17 + 1);
      uVar6 = *(uint *)((long)(p_Var17 + 1) + 4);
    }
    lVar7 = (long)iVar5;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar8 = 0;
    }
    while (bVar18 = uVar8 != 0, uVar8 = uVar8 - 1, bVar18) {
      pp_Var1 = (pmVar10->TargetsImages).
                super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pp_Var1[lVar7] != p_Var14) {
        pp_Var1[lVar7] = p_Var14;
        (pmVar10->TargetsTable).
        super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = (__tgt_target_table *)0x0;
      }
      lVar7 = lVar7 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&TrlTblMtx);
    local_148 = desc;
    for (iVar5 = 0;
        pDVar4 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start, p_Var15 = local_160, __x = local_158,
        iVar5 < *(int *)((long)(p_Var17 + 1) + 4); iVar5 = iVar5 + 1) {
      lVar7 = (long)iVar5 + (long)*(int *)pp_Var3;
      pDVar2 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
               super__Vector_impl_data._M_start + lVar7;
      std::mutex::lock(&pDVar2->PendingGlobalsMtx);
      pDVar4[lVar7].HasPendingGlobals = true;
      this_00 = &pDVar4[lVar7].PendingCtorsDtors;
      for (p_Var16 = p_Var14->EntriesBegin; p_Var16 != p_Var14->EntriesEnd; p_Var16 = p_Var16 + 1) {
        if ((p_Var16->flags & 2U) == 0) {
          if ((p_Var16->flags & 4U) != 0) {
            pmVar11 = std::
                      map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                      ::operator[](this_00,(key_type *)&local_148);
            std::__cxx11::list<void_*,_std::allocator<void_*>_>::push_front
                      (&pmVar11->PendingDtors,&p_Var16->addr);
          }
        }
        else {
          pmVar11 = std::
                    map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                    ::operator[](this_00,(key_type *)&local_148);
          std::__cxx11::list<void_*,_std::allocator<void_*>_>::push_back
                    (&pmVar11->PendingCtors,&p_Var16->addr);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pDVar2->PendingGlobalsMtx);
    }
LAB_00103ec8:
    lVar7 = local_150 + 1;
  } while( true );
}

Assistant:

void RTLsTy::RegisterLib(__tgt_bin_desc *desc) {
  // Attempt to load all plugins available in the system.
  std::call_once(initFlag, &RTLsTy::LoadRTLs, this);

  RTLsMtx.lock();
  // Register the images with the RTLs that understand them, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image.
    for (auto &R : RTLs.AllRTLs) {
      if (!R.is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL %s!\n",
            DPxPTR(img->ImageStart), R.RTLName.c_str());
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());

      // If this RTL is not already in use, initialize it.
      if (!R.isUsed) {
        // Initialize the device information for the RTL we are about to use.
        DeviceTy device(&R);
        size_t start = Devices.size();
        Devices.resize(start + R.NumberOfDevices, device);
        for (int32_t device_id = 0; device_id < R.NumberOfDevices;
            device_id++) {
          // global device ID
          Devices[start + device_id].DeviceID = start + device_id;
          // RTL local device ID
          Devices[start + device_id].RTLDeviceID = device_id;
        }

        // Initialize the index of this RTL and save it in the used RTLs.
        R.Idx = (RTLs.UsedRTLs.empty())
                    ? 0
                    : RTLs.UsedRTLs.back()->Idx +
                          RTLs.UsedRTLs.back()->NumberOfDevices;
        assert((size_t) R.Idx == start &&
            "RTL index should equal the number of devices used so far.");
        R.isUsed = true;
        RTLs.UsedRTLs.push_back(&R);

        DP("RTL " DPxMOD " has index %d!\n", DPxPTR(R.LibraryHandler), R.Idx);
      }

      // Initialize (if necessary) translation table for this library.
      TrlTblMtx.lock();
      if(!HostEntriesBeginToTransTable.count(desc->HostEntriesBegin)){
        TranslationTable &tt =
            HostEntriesBeginToTransTable[desc->HostEntriesBegin];
        tt.HostTable.EntriesBegin = desc->HostEntriesBegin;
        tt.HostTable.EntriesEnd = desc->HostEntriesEnd;
      }

      // Retrieve translation table for this library.
      TranslationTable &TransTable =
          HostEntriesBeginToTransTable[desc->HostEntriesBegin];

      DP("Registering image " DPxMOD " with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());
      RegisterImageIntoTranslationTable(TransTable, R, img);
      TrlTblMtx.unlock();
      FoundRTL = &R;

      // Load ctors/dtors for static objects
      RegisterGlobalCtorsDtorsForImage(desc, img, FoundRTL);

      // if an RTL was found we are done - proceed to register the next image
      break;
    }

    if (!FoundRTL) {
      DP("No RTL found for image " DPxMOD "!\n", DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();


  DP("Done registering entries!\n");
}